

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQPOMDP.cpp
# Opt level: O0

void __thiscall
FactoredQLastTimeStepOrQPOMDP::FactoredQLastTimeStepOrQPOMDP
          (FactoredQLastTimeStepOrQPOMDP *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  pointer puVar1;
  FactoredQLastTimeStepOrElse *in_RSI;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  PlanningUnitFactoredDecPOMDPDiscrete *in_stack_ffffffffffffffe0;
  void **in_stack_ffffffffffffffe8;
  
  QFunctionInterface::QFunctionInterface((QFunctionInterface *)in_RDI);
  QFunctionForDecPOMDPInterface::QFunctionForDecPOMDPInterface
            ((QFunctionForDecPOMDPInterface *)in_RDI,&PTR_PTR_00d08af0);
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem,
             &PTR_construction_vtable_152__00d08b00);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd08888;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd08888;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)0xd08888;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem =
       (MultiAgentDecisionProcessInterface *)0xd089d0;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_problem =
       (MultiAgentDecisionProcessInterface *)0xd089d0;
  puVar1 = (pointer)operator_new(0x60);
  QPOMDP::QPOMDP((QPOMDP *)in_stack_ffffffffffffffe0,in_RDI);
  (in_RDI->super_PlanningUnitMADPDiscrete)._m_nrObservationHistories.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar1;
  return;
}

Assistant:

FactoredQLastTimeStepOrQPOMDP::
FactoredQLastTimeStepOrQPOMDP(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QPOMDP=new QPOMDP(puf);
}